

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t farmhash32_mk_len_5_to_12(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  uint in_EDX;
  ulong in_RSI;
  char *in_RDI;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  
  fetch32(in_RDI);
  fetch32(in_RDI + (in_RSI - 4));
  fetch32(in_RDI + (in_RSI >> 1 & 4));
  mur(0,0x2b640c);
  mur(0,0x2b6417);
  uVar1 = mur(0,0x2b6422);
  uVar1 = fmix(in_EDX ^ uVar1);
  return uVar1;
}

Assistant:

static inline uint32_t farmhash32_mk_len_5_to_12(const char *s, size_t len, uint32_t seed) {
  uint32_t a = len, b = len * 5, c = 9, d = b + seed;
  a += fetch32(s);
  b += fetch32(s + len - 4);
  c += fetch32(s + ((len >> 1) & 4));
  return fmix(seed ^ mur(c, mur(b, mur(a, d))));
}